

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_export.cpp
# Opt level: O2

CopyFunction * __thiscall
duckdb::LogicalExport::GetCopyFunction
          (CopyFunction *__return_storage_ptr__,LogicalExport *this,ClientContext *context,
          CopyInfo *info)

{
  CopyFunctionCatalogEntry *pCVar1;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  ::std::__cxx11::string::string((string *)&local_38,anon_var_dwarf_3b6586a + 9,&local_59);
  ::std::__cxx11::string::string((string *)&local_58,"main",&local_5a);
  pCVar1 = Catalog::GetEntry<duckdb::CopyFunctionCatalogEntry>
                     (context,&local_38,&local_58,&info->format,
                      (QueryErrorContext)0xffffffffffffffff);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  CopyFunction::CopyFunction(__return_storage_ptr__,&pCVar1->function);
  return __return_storage_ptr__;
}

Assistant:

CopyFunction LogicalExport::GetCopyFunction(ClientContext &context, CopyInfo &info) {
	auto &copy_entry =
	    Catalog::GetEntry<CopyFunctionCatalogEntry>(context, INVALID_CATALOG, DEFAULT_SCHEMA, info.format);
	return copy_entry.function;
}